

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O2

int __thiscall iqnet::Socket::accept(Socket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int h;
  network_error *this_00;
  undefined4 in_register_00000034;
  allocator<char> local_4d;
  socklen_t len;
  string local_48;
  sockaddr_in addr;
  
  len = 0x10;
  h = ::accept(*(int *)(CONCAT44(in_register_00000034,__fd) + 8),(sockaddr *)&addr,&len);
  if (h != -1) {
    Inet_addr::Inet_addr((Inet_addr *)&local_48,&addr);
    Socket(this,h,(Inet_addr *)&local_48);
    Inet_addr::~Inet_addr((Inet_addr *)&local_48);
    return (int)this;
  }
  this_00 = (network_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Socket::accept",&local_4d)
  ;
  network_error::network_error(this_00,&local_48,true,0);
  __cxa_throw(this_00,&network_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Socket Socket::accept()
{
  sockaddr_in addr;
  socklen_t len = sizeof(sockaddr_in);

  Handler new_sock = ::accept( sock, reinterpret_cast<sockaddr*>(&addr), &len );
  if( new_sock == -1 )
    throw network_error( "Socket::accept" );

  return Socket( new_sock, Inet_addr(addr) );
}